

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastrender.h
# Opt level: O0

void __thiscall
SQCompilation::RenderVisitor::visitIfStatement(RenderVisitor *this,IfStatement *ifstmt)

{
  Statement *pSVar1;
  IfStatement *in_RSI;
  RenderVisitor *in_RDI;
  Node *unaff_retaddr;
  RenderVisitor *visitor;
  
  visitor = in_RDI;
  OutputStream::writeString((OutputStream *)in_RSI,(char *)in_RDI);
  IfStatement::condition(in_RSI);
  Node::visit<SQCompilation::RenderVisitor>(unaff_retaddr,visitor);
  OutputStream::writeString((OutputStream *)in_RSI,(char *)in_RDI);
  indent((RenderVisitor *)in_RSI,(int)((ulong)in_RDI >> 0x20));
  OutputStream::writeString((OutputStream *)in_RSI,(char *)in_RDI);
  in_RDI->_indent = in_RDI->_indent + 2;
  IfStatement::thenBranch(in_RSI);
  Node::visit<SQCompilation::RenderVisitor>(unaff_retaddr,visitor);
  pSVar1 = IfStatement::elseBranch(in_RSI);
  if (pSVar1 != (Statement *)0x0) {
    newLine((RenderVisitor *)0x122853);
    indent((RenderVisitor *)in_RSI,(int)((ulong)in_RDI >> 0x20));
    OutputStream::writeString((OutputStream *)in_RSI,(char *)in_RDI);
    IfStatement::elseBranch(in_RSI);
    Node::visit<SQCompilation::RenderVisitor>(unaff_retaddr,visitor);
  }
  in_RDI->_indent = in_RDI->_indent + -2;
  newLine((RenderVisitor *)0x1228a5);
  indent((RenderVisitor *)in_RSI,(int)((ulong)in_RDI >> 0x20));
  OutputStream::writeString((OutputStream *)in_RSI,(char *)in_RDI);
  return;
}

Assistant:

virtual void visitIfStatement(IfStatement *ifstmt) {
        _out->writeString("IF (");
        ifstmt->condition()->visit(this);
        _out->writeString(")\n");
        indent(_indent);
        _out->writeString("THEN ");
        _indent += 2;
        ifstmt->thenBranch()->visit(this);
        if (ifstmt->elseBranch()) {
            newLine();
            indent(_indent - 2);
            _out->writeString("ELSE ");
            ifstmt->elseBranch()->visit(this);
        }
        _indent -= 2;
        newLine();
        indent(_indent);
        _out->writeString("END_IF");

    }